

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

string * flatbuffers::IntToStringHex<unsigned_char>(string *__return_storage_ptr__,uchar i)

{
  uint *puVar1;
  long lVar2;
  stringstream ss;
  undefined1 auStack_1a8 [7];
  uchar local_1a1;
  stringstream local_1a0 [16];
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  lVar2 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar2 + 1] == '\0') {
    std::ios::widen((char)auStack_1a8 + (char)lVar2 + '\x18');
    acStack_b0[lVar2 + 1] = '\x01';
  }
  acStack_b0[lVar2] = '0';
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  local_1a1 = i;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)&local_1a1,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToStringHex(T i) {
  std::stringstream ss;
  ss << std::setw(sizeof(T) * 2)
     << std::setfill('0')
     << std::hex
     << std::uppercase
     << i;
  return ss.str();
}